

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader15.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader15::begin__vertex_weights
          (LibraryControllersLoader15 *this,vertex_weights__AttributeData *attributeData)

{
  byte bVar1;
  uint *in_RSI;
  long in_RDI;
  bool bVar2;
  vertex_weights__AttributeData attrData;
  uint local_20 [2];
  undefined8 local_18;
  
  bVar2 = (*in_RSI & 1) == 1;
  if (bVar2) {
    local_18 = *(undefined8 *)(in_RSI + 2);
  }
  local_20[0] = (uint)bVar2;
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x108))(*(long **)(in_RDI + 0x20),local_20);
  return (bool)(bVar1 & 1);
}

Assistant:

bool LibraryControllersLoader15::begin__vertex_weights( const COLLADASaxFWL15::vertex_weights__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__vertex_weights(attributeData));
COLLADASaxFWL::vertex_weights__AttributeData attrData;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::vertex_weights__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL15::vertex_weights__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::vertex_weights__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__vertex_weights(attrData);
}